

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall vkt::shaderexecutor::Functions::Exp2::Exp2(Exp2 *this)

{
  allocator<char> local_31;
  string local_30;
  Exp2 *local_10;
  Exp2 *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"exp2",&local_31);
  ExpFunc::ExpFunc(&this->super_ExpFunc,&local_30,deExp2);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_ExpFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__Exp2_01681718;
  return;
}

Assistant:

Exp (void)	: ExpFunc("exp", deExp) {}